

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O2

void exp_vartime_precomp(uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,uint64_t *b
                        ,uint64_t *res)

{
  uint32_t len;
  uint64_t uVar1;
  uint32_t l;
  uint32_t i;
  uint i_00;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  uint64_t *ctx_r2;
  uint64_t aM [64];
  uint64_t resM [64];
  uint64_t aM_1 [64];
  uint64_t table [1024];
  uint64_t tmp0 [64];
  uint64_t tmp [64];
  uint64_t local_2c38 [64];
  uint64_t local_2a38 [64];
  uint64_t local_2838 [64];
  uint64_t auStack_2638 [64];
  uint64_t local_2438 [64];
  uint64_t local_2238 [64];
  uint64_t local_2038 [64];
  uint64_t local_1e38 [64];
  uint64_t local_1c38 [64];
  uint64_t local_1a38 [64];
  uint64_t local_1838 [64];
  uint64_t local_1638 [64];
  uint64_t local_1438 [64];
  undefined1 local_1238 [512];
  uint64_t local_1038 [64];
  undefined1 local_e38 [512];
  uint64_t local_c38 [64];
  undefined1 local_a38 [512];
  uint64_t local_838 [64];
  undefined1 local_638 [512];
  uint64_t local_438 [64];
  uint64_t local_238 [65];
  uint64_t *puVar2;
  
  if (bBits < 200) {
    memset(local_2838,0,0x200);
    to(n,mu,r2,a,local_2838);
    memset(local_2c38,0,0x200);
    memcpy(local_2438,n,0x200);
    memcpy(local_2238,r2,0x200);
    from(local_2438,mu,local_2238,local_2c38);
    for (uVar3 = 0; bBits != (uint32_t)uVar3; uVar3 = (ulong)((uint32_t)uVar3 + 1)) {
      if ((b[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
        amont_mul(local_2438,mu,local_2c38,local_2838,local_2c38);
      }
      amont_sqr(local_2438,mu,local_2838,local_2838);
    }
    puVar2 = local_2c38;
  }
  else {
    memset(local_2c38,0,0x200);
    to(n,mu,r2,a,local_2c38);
    memset(local_2a38,0,0x200);
    len = (bBits - 1 >> 6) + 1;
    memcpy(local_2838,n,0x200);
    memcpy(auStack_2638,r2,0x200);
    memset(local_2438,0,0x2000);
    memset(local_238,0,0x200);
    from(local_2838,mu,auStack_2638,local_2438);
    memcpy(local_2238,local_2c38,0x200);
    amont_sqr(local_2838,mu,local_2238,local_238);
    memcpy(local_2038,local_238,0x200);
    amont_mul(local_2838,mu,local_2c38,local_2038,local_238);
    memcpy(local_1e38,local_238,0x200);
    amont_sqr(local_2838,mu,local_2038,local_238);
    memcpy(local_1c38,local_238,0x200);
    amont_mul(local_2838,mu,local_2c38,local_1c38,local_238);
    memcpy(local_1a38,local_238,0x200);
    amont_sqr(local_2838,mu,local_1e38,local_238);
    memcpy(local_1838,local_238,0x200);
    amont_mul(local_2838,mu,local_2c38,local_1838,local_238);
    memcpy(local_1638,local_238,0x200);
    amont_sqr(local_2838,mu,local_1c38,local_238);
    memcpy(local_1438,local_238,0x200);
    amont_mul(local_2838,mu,local_2c38,local_1438,local_238);
    memcpy(local_1238,local_238,0x200);
    amont_sqr(local_2838,mu,local_1a38,local_238);
    memcpy(local_1038,local_238,0x200);
    amont_mul(local_2838,mu,local_2c38,local_1038,local_238);
    memcpy(local_e38,local_238,0x200);
    amont_sqr(local_2838,mu,local_1838,local_238);
    memcpy(local_c38,local_238,0x200);
    amont_mul(local_2838,mu,local_2c38,local_c38,local_238);
    memcpy(local_a38,local_238,0x200);
    amont_sqr(local_2838,mu,local_1638,local_238);
    puVar2 = local_838;
    memcpy(puVar2,local_238,0x200);
    amont_mul(local_2838,mu,local_2c38,puVar2,local_238);
    l = (uint32_t)puVar2;
    memcpy(local_638,local_238,0x200);
    if ((bBits & 3) == 0) {
      from(local_2838,mu,auStack_2638,local_2a38);
      i_00 = bBits;
    }
    else {
      uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(len,b,bBits & 0xfffffffc,l);
      memcpy(local_2a38,local_2438 + uVar1 * 0x40,0x200);
      i_00 = bBits & 0xfffffffc;
    }
    memset(local_438,0,0x200);
    uVar4 = bBits >> 2;
    while( true ) {
      i_00 = i_00 - 4;
      bVar5 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar5) break;
      amont_sqr(local_2838,mu,local_2a38,local_2a38);
      amont_sqr(local_2838,mu,local_2a38,local_2a38);
      amont_sqr(local_2838,mu,local_2a38,local_2a38);
      puVar2 = local_2a38;
      amont_sqr(local_2838,mu,local_2a38,local_2a38);
      uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(len,b,i_00,(uint32_t)puVar2);
      memcpy(local_438,local_2438 + uVar1 * 0x40,0x200);
      amont_mul(local_2838,mu,local_2a38,local_438,local_2a38);
    }
    puVar2 = local_2a38;
  }
  from(n,mu,puVar2,res);
  return;
}

Assistant:

static inline void
exp_vartime_precomp(
  uint64_t *n,
  uint64_t mu,
  uint64_t *r2,
  uint64_t *a,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *res
)
{
  if (bBits < 200U)
  {
    uint64_t aM[4U] = { 0U };
    to(n, mu, r2, a, aM);
    uint64_t resM[4U] = { 0U };
    uint64_t ctx[8U] = { 0U };
    memcpy(ctx, n, 4U * sizeof (uint64_t));
    memcpy(ctx + 4U, r2, 4U * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + 4U;
    from(ctx_n, mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 64U;
      uint32_t j = i % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      if (!(bit == 0ULL))
      {
        uint64_t *ctx_n0 = ctx;
        amont_mul(ctx_n0, mu, resM, aM, resM);
      }
      uint64_t *ctx_n0 = ctx;
      amont_sqr(ctx_n0, mu, aM, aM);
    }
    from(n, mu, resM, res);
    return;
  }
  uint64_t aM[4U] = { 0U };
  to(n, mu, r2, a, aM);
  uint64_t resM[4U] = { 0U };
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 64U + 1U;
  }
  uint64_t ctx[8U] = { 0U };
  memcpy(ctx, n, 4U * sizeof (uint64_t));
  memcpy(ctx + 4U, r2, 4U * sizeof (uint64_t));
  uint64_t table[64U] = { 0U };
  uint64_t tmp[4U] = { 0U };
  uint64_t *t0 = table;
  uint64_t *t1 = table + 4U;
  uint64_t *ctx_n0 = ctx;
  uint64_t *ctx_r20 = ctx + 4U;
  from(ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, 4U * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * 4U;
    uint64_t *ctx_n1 = ctx;
    amont_sqr(ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * 4U, tmp, 4U * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * 4U;
    uint64_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * 4U, tmp, 4U * sizeof (uint64_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i = bBits / 4U * 4U;
    uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i, 4U);
    uint32_t bits_l32 = (uint32_t)bits_c;
    const uint64_t *a_bits_l = table + bits_l32 * 4U;
    memcpy(resM, (uint64_t *)a_bits_l, 4U * sizeof (uint64_t));
  }
  else
  {
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + 4U;
    from(ctx_n, mu, ctx_r2, resM);
  }
  uint64_t tmp0[4U] = { 0U };
  for (uint32_t i = 0U; i < bBits / 4U; i++)
  {
    KRML_MAYBE_FOR4(i0,
      0U,
      4U,
      1U,
      uint64_t *ctx_n = ctx;
      amont_sqr(ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k, 4U);
    uint32_t bits_l32 = (uint32_t)bits_l;
    const uint64_t *a_bits_l = table + bits_l32 * 4U;
    memcpy(tmp0, (uint64_t *)a_bits_l, 4U * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, resM, tmp0, resM);
  }
  from(n, mu, resM, res);
}